

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum2.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_preserve_unknown_enum_unittest::MyMessage::_InternalSerialize
          (MyMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<int> *pRVar1;
  int *piVar2;
  uint32_t field_number;
  int iVar3;
  uint8_t *puVar4;
  const_reference piVar5;
  const_pointer piVar6;
  byte *pbVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  LogMessageFatal local_40;
  
  if ((undefined1  [80])((undefined1  [80])this->field_0 & (undefined1  [80])0x1) !=
      (undefined1  [80])0x0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (1,(this->field_0)._impl_.e_,puVar4);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_e_;
  iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
  iVar10 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != iVar10; iVar10 = iVar10 + 1) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar5 = google::protobuf::RepeatedField<int>::Get(pRVar1,iVar10);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(2,*piVar5,puVar4);
  }
  uVar9 = (this->field_0)._impl_._repeated_packed_e_cached_byte_size_.atom_;
  if (uVar9 != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar4) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    pRVar1 = &(this->field_0)._impl_.repeated_packed_e_;
    *puVar4 = '\x1a';
    target = puVar4 + 2;
    for (; 0x7f < uVar9; uVar9 = uVar9 >> 7) {
      target[-1] = (byte)uVar9 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar9;
    piVar6 = google::protobuf::RepeatedField<int>::data(pRVar1);
    iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
    piVar2 = piVar6 + iVar3;
    do {
      pbVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar8 = (ulong)*piVar6;
      while( true ) {
        target = pbVar7 + 1;
        if (uVar8 < 0x80) break;
        *pbVar7 = (byte)uVar8 | 0x80;
        uVar8 = uVar8 >> 7;
        pbVar7 = target;
      }
      piVar6 = piVar6 + 1;
      *pbVar7 = (byte)uVar8;
    } while (piVar6 < piVar2);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_packed_unexpected_e_;
  iVar3 = google::protobuf::RepeatedField<int>::size(pRVar1);
  iVar10 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != iVar10; iVar10 = iVar10 + 1) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar5 = google::protobuf::RepeatedField<int>::Get(pRVar1,iVar10);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(4,*piVar5,puVar4);
  }
  field_number = (this->field_0)._impl_._oneof_case_[0];
  if (field_number - 5 < 2) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    iVar3 = 0;
    if ((this->field_0)._impl_._oneof_case_[0] == field_number) {
      iVar3 = (this->field_0)._impl_.o_.oneof_e_1_;
    }
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(field_number,iVar3,puVar4)
    ;
  }
  uVar8 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar8 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar8 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL MyMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const MyMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_preserve_unknown_enum_unittest.MyMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_preserve_unknown_enum_unittest.MyEnum e = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_e(), target);
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_e = 2;
  for (int i = 0, n = this_._internal_repeated_e_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, static_cast<::proto2_preserve_unknown_enum_unittest::MyEnum>(this_._internal_repeated_e().Get(i)),
        target);
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_e = 3 [features = {
  {
    ::size_t byte_size = this_._impl_._repeated_packed_e_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          3, this_._internal_repeated_packed_e(), byte_size, target);
    }
  }

  // repeated .proto2_preserve_unknown_enum_unittest.MyEnum repeated_packed_unexpected_e = 4;
  for (int i = 0, n = this_._internal_repeated_packed_unexpected_e_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, static_cast<::proto2_preserve_unknown_enum_unittest::MyEnum>(this_._internal_repeated_packed_unexpected_e().Get(i)),
        target);
  }

  switch (this_.o_case()) {
    case kOneofE1: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          5, this_._internal_oneof_e_1(), target);
      break;
    }
    case kOneofE2: {
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::WriteEnumToArray(
          6, this_._internal_oneof_e_2(), target);
      break;
    }
    default:
      break;
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_preserve_unknown_enum_unittest.MyMessage)
  return target;
}